

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VWL2Norm(N_Vector X,N_Vector W,sunindextype param_3,sunindextype global_length,int myid)

{
  int iVar1;
  double dVar2;
  realtype rVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double __x;
  
  N_VConst(-0.5,X);
  N_VConst(0.5,W);
  dVar2 = get_time();
  rVar3 = N_VWL2Norm(X,W);
  sync_device();
  dVar4 = get_time();
  dVar5 = 0.0;
  if (0.0 <= rVar3) {
    if (0 < global_length) {
      __x = (double)global_length;
      dVar5 = SQRT(__x);
      dVar6 = dVar5;
      if (__x < 0.0) {
        dVar6 = sqrt(__x);
      }
      if (__x < 0.0) {
        dVar5 = sqrt(__x);
      }
      rVar3 = dVar6 * -0.25 + rVar3;
      dVar5 = dVar5 * 0.25;
    }
    if (ABS(rVar3 / dVar5) <= 1e-15) {
      iVar1 = 0;
      if (myid == 0) {
        puts("PASSED test -- N_VWL2Norm ");
      }
      goto LAB_00104d0a;
    }
  }
  printf(">>> FAILED test -- N_VWL2Norm, Proc %d \n",(ulong)(uint)myid);
  iVar1 = 1;
LAB_00104d0a:
  max_time(X,dVar4 - dVar2);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VWL2Norm");
  }
  return iVar1;
}

Assistant:

int Test_N_VWL2Norm(N_Vector X, N_Vector W,
                    sunindextype local_length, sunindextype global_length, int myid)
{
  int      fails = 0, failure = 0;
  double   start_time, stop_time, maxt;
  realtype ans;

  /* fill vector data */
  N_VConst(NEG_HALF, X);
  N_VConst(HALF, W);

  start_time = get_time();
  ans = N_VWL2Norm(X, W);
  sync_device();
  stop_time = get_time();

  /* ans should equal 1/4 * sqrt(global_length) */
  failure = (ans < ZERO) ? 1 : FNEQ(ans, HALF*HALF*SUNRsqrt((realtype) global_length));

  if (failure) {
    printf(">>> FAILED test -- N_VWL2Norm, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VWL2Norm \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VWL2Norm", maxt);

  return(fails);
}